

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_path_(lyd_node *parent,ly_ctx *ctx,lysc_ext_instance *ext,char *path,void *value,
                    size_t value_len,LYD_ANYDATA_VALUETYPE value_type,uint32_t options,
                    lyd_node **new_parent,lyd_node **new_node)

{
  long lVar1;
  lysc_ext_instance *plVar2;
  lysc_ext_instance *plVar3;
  void *str_path;
  uint16_t uVar4;
  LY_ERR LVar5;
  int iVar6;
  size_t sVar7;
  lysc_node *plVar8;
  char *pcVar9;
  size_t sVar10;
  lyd_node *siblings;
  char *pcVar11;
  bool bVar12;
  undefined8 in_stack_fffffffffffffdd8;
  undefined4 uVar13;
  void *local_1e0;
  char *local_1b0;
  char *local_180;
  void *local_148;
  ly_ctx *local_130;
  void *local_128;
  void *local_118;
  lysc_node *local_108;
  void *local_100;
  void *local_f0;
  ly_ctx *local_d0;
  uint local_c4;
  uint32_t local_c0;
  uint32_t count;
  uint32_t hints;
  LY_VALUE_FORMAT format;
  uint64_t orig_count;
  uint64_t path_idx;
  ly_bool any_use_value;
  lyd_value *plStack_a0;
  ly_bool store_only;
  lyd_value *val;
  lysc_node *schema;
  lyd_node *iter;
  lyd_node *cur_parent;
  lyd_node *node;
  lyd_node *nnode;
  lyd_node *nparent;
  ly_path *p;
  lyxp_expr *exp;
  LY_ERR r;
  LY_ERR ret;
  size_t value_len_local;
  void *value_local;
  char *path_local;
  lysc_ext_instance *ext_local;
  ly_ctx *ctx_local;
  lyd_node *parent_local;
  
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  exp._4_4_ = 0;
  p = (ly_path *)0x0;
  nparent = (lyd_node *)0x0;
  nnode = (lyd_node *)0x0;
  node = (lyd_node *)0x0;
  cur_parent = (lyd_node *)0x0;
  plStack_a0 = (lyd_value *)0x0;
  path_idx._7_1_ = (options & 2) != 0;
  path_idx._6_1_ = (options & 0x100) != 0;
  orig_count = 0;
  _hints = (void *)0x0;
  _r = value_len;
  value_len_local = (size_t)value;
  value_local = path;
  path_local = (char *)ext;
  ext_local = (lysc_ext_instance *)ctx;
  ctx_local = (ly_ctx *)parent;
  if ((parent == (lyd_node *)0x0) && (ctx == (ly_ctx *)0x0)) {
    __assert_fail("parent || ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x686,
                  "LY_ERR lyd_new_path_(struct lyd_node *, const struct ly_ctx *, const struct lysc_ext_instance *, const char *, const void *, size_t, LYD_ANYDATA_VALUETYPE, uint32_t, struct lyd_node **, struct lyd_node **)"
                 );
  }
  if ((path == (char *)0x0) || ((*path != '/' && (parent == (lyd_node *)0x0)))) {
    __assert_fail("path && ((path[0] == \'/\') || parent)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x687,
                  "LY_ERR lyd_new_path_(struct lyd_node *, const struct ly_ctx *, const struct lysc_ext_instance *, const char *, const void *, size_t, LYD_ANYDATA_VALUETYPE, uint32_t, struct lyd_node **, struct lyd_node **)"
                 );
  }
  if (ctx == (ly_ctx *)0x0) {
    if (parent->schema == (lysc_node *)0x0) {
      local_d0 = (ly_ctx *)parent[2].schema;
    }
    else {
      local_d0 = parent->schema->module->ctx;
    }
    ext_local = (lysc_ext_instance *)local_d0;
  }
  if ((value != (void *)0x0) && (value_len == 0)) {
    _r = strlen((char *)value);
  }
  exp._4_4_ = lyd_new_val_get_format(options,&count);
  plVar3 = ext_local;
  str_path = value_local;
  LVar5 = exp._4_4_;
  if (exp._4_4_ == LY_SUCCESS) {
    sVar7 = strlen((char *)value_local);
    exp._4_4_ = ly_path_parse((ly_ctx *)plVar3,(lysc_node *)0x0,(char *)str_path,sVar7,'\0',2,0x40,
                              0x200,(lyxp_expr **)&p);
    plVar3 = ext_local;
    LVar5 = exp._4_4_;
    if (exp._4_4_ == LY_SUCCESS) {
      plVar8 = lyd_node_schema((lyd_node *)ctx_local);
      uVar4 = 1;
      if ((options & 1) != 0) {
        uVar4 = 2;
      }
      exp._4_4_ = ly_path_compile((ly_ctx *)plVar3,(lys_module *)0x0,plVar8,
                                  (lysc_ext_instance *)path_local,(lyxp_expr *)p,uVar4,0x20,'\0',
                                  LY_VALUE_JSON,(void *)0x0,(ly_path **)&nparent);
      LVar5 = exp._4_4_;
      if (exp._4_4_ == LY_SUCCESS) {
        if (nparent == (lyd_node *)0x0) {
          local_f0 = (void *)0x0;
        }
        else {
          local_f0 = nparent[-1].priv;
        }
        _hints = local_f0;
        exp._4_4_ = lyd_new_path_check_find_lypath
                              ((ly_path *)nparent,(char *)value_local,(char *)value_len_local,_r,
                               count,options);
        LVar5 = exp._4_4_;
        if (exp._4_4_ == LY_SUCCESS) {
          if (ctx_local != (ly_ctx *)0x0) {
            exp._0_4_ = ly_path_eval_partial
                                  ((ly_path *)nparent,(lyd_node *)ctx_local,(lyxp_var *)0x0,
                                   (byte)options & 0x80,&orig_count,&cur_parent);
            if ((LY_ERR)exp == LY_SUCCESS) {
              if (nparent == (lyd_node *)0x0) {
                local_100 = (void *)0x0;
              }
              else {
                local_100 = nparent[-1].priv;
              }
              if (_hints == local_100) {
                if (((options & 0x20) == 0) && ((cur_parent->flags & 1) == 0)) {
                  ly_log_location((lysc_node *)0x0,cur_parent,(char *)0x0,(ly_in *)0x0);
                  ly_vlog((ly_ctx *)ext_local,(char *)0x0,LYVE_REFERENCE,
                          "Path \"%s\" already exists.",value_local);
                  ly_log_location_revert(0,1,0,0);
                  exp._4_4_ = LY_EEXIST;
                  LVar5 = exp._4_4_;
                }
                else if (((options & 0x20) == 0) ||
                        (((cur_parent->schema == (lysc_node *)0x0 ||
                          (cur_parent->schema->nodetype != 4)) ||
                         (LVar5 = exp._4_4_, (cur_parent->schema->flags & 0x100) == 0)))) {
                  LVar5 = lyd_new_path_update(cur_parent,(void *)value_len_local,_r,value_type,count
                                              ,&nnode,&node);
                }
                goto LAB_0014541c;
              }
            }
            else if ((LY_ERR)exp == LY_EINCOMPLETE) {
              orig_count = orig_count + 1;
            }
            else {
              LVar5 = (LY_ERR)exp;
              if ((LY_ERR)exp != LY_ENOTFOUND) goto LAB_0014541c;
              lVar1._0_4_ = nparent->hash;
              lVar1._4_4_ = nparent->flags;
              if (lVar1 == 0) {
                local_108 = (lysc_node *)0x0;
              }
              else {
                local_108 = *(lysc_node **)(*(long *)nparent + 0x10);
              }
              plVar8 = lysc_data_node(local_108);
              if (plVar8 != (lysc_node *)0x0) {
                cur_parent = (lyd_node *)ctx_local;
              }
            }
          }
          while( true ) {
            if (nparent == (lyd_node *)0x0) {
              local_118 = (void *)0x0;
            }
            else {
              local_118 = nparent[-1].priv;
            }
            if (_hints <= local_118) break;
            nparent[-1].priv = (void *)((long)nparent[-1].priv + 1);
          }
          if (nparent == (lyd_node *)0x0) {
            local_128 = (void *)0x0;
          }
          else {
            local_128 = nparent[-1].priv;
          }
          if ((((orig_count < local_128) && (*(long *)(&nparent->hash + orig_count * 6) != 0)) &&
              ((((**(short **)(&nparent->hash + orig_count * 6) == 0x10 &&
                 ((*(ushort *)(*(long *)(&nparent->hash + orig_count * 6) + 2) & 0x200) != 0)) ||
                ((**(short **)(&nparent->hash + orig_count * 6) == 8 &&
                 ((*(ushort *)(*(long *)(&nparent->hash + orig_count * 6) + 2) & 1) == 0)))) &&
               ((&nparent->parent)[orig_count * 3] != (lyd_node_inner *)0x0)))) &&
             (((&nparent->parent)[orig_count * 3]->field_0).node.hash == 0)) {
            local_c4 = 0;
            if (cur_parent == (lyd_node *)0x0) {
              local_130 = ctx_local;
            }
            else {
              local_130 = (ly_ctx *)lyd_child(cur_parent);
            }
            lyd_find_sibling_val
                      ((lyd_node *)local_130,*(lysc_node **)(&nparent->hash + orig_count * 6),
                       (char *)0x0,0,(lyd_node **)&schema);
            while( true ) {
              bVar12 = false;
              if (schema != (lysc_node *)0x0) {
                bVar12 = schema->module == *(lys_module **)(&nparent->hash + orig_count * 6);
              }
              if (!bVar12) break;
              local_c4 = local_c4 + 1;
              schema = schema->next;
            }
            if ((lysc_node *)(ulong)(local_c4 + 1) <
                ((&nparent->parent)[orig_count * 3]->field_0).node.schema) {
              if (local_c4 == 0) {
                ly_vlog((ly_ctx *)ext_local,(char *)0x0,LYVE_REFERENCE,
                        "Cannot create \"%s\" on position %lu, no instances exist.",
                        *(undefined8 *)(*(long *)(&nparent->hash + orig_count * 6) + 0x28),
                        ((&nparent->parent)[orig_count * 3]->field_0).node.schema);
              }
              else {
                pcVar11 = "";
                if (1 < local_c4) {
                  pcVar11 = "s";
                }
                pcVar9 = "s";
                if (1 < local_c4) {
                  pcVar9 = "";
                }
                ly_vlog((ly_ctx *)ext_local,(char *)0x0,LYVE_REFERENCE,
                        "Cannot create \"%s\" on position %lu, only %u instance%s exist%s.",
                        *(undefined8 *)(*(long *)(&nparent->hash + orig_count * 6) + 0x28),
                        ((&nparent->parent)[orig_count * 3]->field_0).node.schema,
                        CONCAT44(uVar13,local_c4),pcVar11,pcVar9);
              }
              exp._4_4_ = LY_EINVAL;
              LVar5 = exp._4_4_;
              goto LAB_0014541c;
            }
          }
          do {
            plVar3 = ext_local;
            if (nparent == (lyd_node *)0x0) {
              local_148 = (void *)0x0;
            }
            else {
              local_148 = nparent[-1].priv;
            }
            LVar5 = exp._4_4_;
            if (local_148 <= orig_count) break;
            iter = cur_parent;
            val = *(lyd_value **)(&nparent->hash + orig_count * 6);
            uVar4 = ((lysc_node *)val)->nodetype;
            if (uVar4 == 1) {
LAB_00144d27:
              exp._4_4_ = lyd_create_inner((lysc_node *)val,&cur_parent);
joined_r0x00144d3d:
              LVar5 = exp._4_4_;
              if (exp._4_4_ != LY_SUCCESS) break;
LAB_0014538f:
              if ((&nparent->schema)[orig_count * 3] != (lysc_node *)0x0) {
                cur_parent->flags = cur_parent->flags | 8;
              }
              if (iter == (lyd_node *)0x0) {
                if (ctx_local != (ly_ctx *)0x0) {
                  lyd_insert_node((lyd_node *)0x0,(lyd_node **)&ctx_local,cur_parent,0);
                }
              }
              else {
                lyd_insert_node(iter,(lyd_node **)0x0,cur_parent,0);
              }
            }
            else {
              if (uVar4 != 4) {
                if (uVar4 == 8) {
                  if (((options & 0x40) != 0) &&
                     (((&nparent->parent)[orig_count * 3] == (lyd_node_inner *)0x0 ||
                      (((&nparent->parent)[orig_count * 3]->field_0).node.hash != 2)))) {
                    exp._0_4_ = LY_EVALID;
                    if (((lysc_node *)val != (lysc_node *)0x0) &&
                       (((((lysc_node *)val)->nodetype == 0x10 &&
                         ((((lysc_node *)val)->flags & 0x200) != 0)) ||
                        ((((lysc_node *)val)->nodetype == 8 &&
                         ((((lysc_node *)val)->flags & 1) == 0)))))) {
                      if (value_len_local == 0) {
                        local_180 = "";
                      }
                      else {
                        local_180 = (char *)value_len_local;
                      }
                      exp._0_4_ = lyd_value_validate((ly_ctx *)0x0,(lysc_node *)val,local_180,_r,
                                                     (lyd_node *)0x0,(lysc_type **)0x0,(char **)0x0)
                      ;
                    }
                    if (((LY_ERR)exp != LY_SUCCESS) && ((LY_ERR)exp != LY_EINCOMPLETE)) {
                      local_c0 = 0x100;
                      if (((value_len_local != 0) && (count == 4)) &&
                         (iVar6 = ly_strncmp("[null]",(char *)value_len_local,_r), iVar6 == 0)) {
                        local_c0 = 0x140;
                      }
                      plVar2 = ext_local;
                      pcVar11 = val[1]._canonical;
                      sVar7 = strlen(val[1]._canonical);
                      plVar3 = val->realtype->exts;
                      sVar10 = strlen((char *)val->realtype->exts);
                      exp._4_4_ = lyd_create_opaq((ly_ctx *)plVar2,pcVar11,sVar7,(char *)0x0,0,
                                                  (char *)plVar3,sVar10,(char *)value_len_local,_r,
                                                  (ly_bool *)0x0,count,(void *)0x0,local_c0,
                                                  &cur_parent);
                      goto joined_r0x00145067;
                    }
                  }
                  if (((&nparent->parent)[orig_count * 3] != (lyd_node_inner *)0x0) &&
                     (((&nparent->parent)[orig_count * 3]->field_0).node.hash == 2)) {
                    plStack_a0 = (lyd_value *)
                                 ((long)&(&nparent->parent)[orig_count * 3]->field_0 + 0x10);
                  }
                  if (plStack_a0 == (lyd_value *)0x0) {
                    exp._4_4_ = lyd_create_term((lysc_node *)val,(char *)value_len_local,_r,'\0',
                                                path_idx._7_1_,(ly_bool *)0x0,count,(void *)0x0,
                                                0x3f3,(ly_bool *)0x0,&cur_parent);
                  }
                  else {
                    exp._4_4_ = lyd_create_term2((lysc_node *)val,plStack_a0,&cur_parent);
                  }
                }
                else if (uVar4 == 0x10) {
                  if (((lysc_node *)val == (lysc_node *)0x0) ||
                     (((((lysc_node *)val)->nodetype != 0x10 ||
                       ((((lysc_node *)val)->flags & 0x200) == 0)) &&
                      ((((lysc_node *)val)->nodetype != 8 || ((((lysc_node *)val)->flags & 1) != 0))
                      )))) {
                    if (((options & 0x40) == 0) ||
                       ((&nparent->parent)[orig_count * 3] != (lyd_node_inner *)0x0)) {
                      exp._4_4_ = lyd_create_list((lysc_node *)val,
                                                  (ly_path_predicate *)
                                                  (&nparent->parent)[orig_count * 3],(lyxp_var *)0x0
                                                  ,path_idx._7_1_,&cur_parent);
                    }
                    else {
                      pcVar11 = ((lysc_node *)val)->name;
                      sVar7 = strlen(((lysc_node *)val)->name);
                      plVar2 = val->realtype->exts;
                      sVar10 = strlen((char *)val->realtype->exts);
                      exp._4_4_ = lyd_create_opaq((ly_ctx *)plVar3,pcVar11,sVar7,(char *)0x0,0,
                                                  (char *)plVar2,sVar10,(char *)0x0,0,(ly_bool *)0x0
                                                  ,LY_VALUE_JSON,(void *)0x0,0x80,&cur_parent);
                    }
                    goto joined_r0x00144d3d;
                  }
                  exp._4_4_ = lyd_create_inner((lysc_node *)val,&cur_parent);
                }
                else {
                  if ((uVar4 != 0x20) && (uVar4 != 0x60)) {
                    if (((uVar4 == 0x100) || (uVar4 == 0x200)) || (uVar4 == 0x400))
                    goto LAB_00144d27;
                    ly_log((ly_ctx *)ext_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                           ,0x73e);
                    exp._4_4_ = LY_EINT;
                    LVar5 = exp._4_4_;
                    break;
                  }
                  exp._4_4_ = lyd_create_any((lysc_node *)val,(void *)value_len_local,value_type,
                                             path_idx._6_1_,&cur_parent);
                }
joined_r0x00145067:
                LVar5 = exp._4_4_;
                if (exp._4_4_ == LY_SUCCESS) goto LAB_0014538f;
                break;
              }
              if ((((lysc_node *)val == (lysc_node *)0x0) || (((lysc_node *)val)->nodetype != 4)) ||
                 (((((lysc_node *)val)->flags & 0x100) == 0 ||
                  (cur_parent->schema == (lysc_node *)0x0)))) {
                if ((options & 0x40) != 0) {
                  if ((cur_parent == (lyd_node *)0x0) || (cur_parent->schema != (lysc_node *)0x0)) {
                    if (value_len_local == 0) {
                      local_1b0 = "";
                    }
                    else {
                      local_1b0 = (char *)value_len_local;
                    }
                    exp._0_4_ = lyd_value_validate((ly_ctx *)0x0,(lysc_node *)val,local_1b0,_r,
                                                   (lyd_node *)0x0,(lysc_type **)0x0,(char **)0x0);
                  }
                  else {
                    exp._0_4_ = LY_ENOT;
                  }
                  if (((LY_ERR)exp != LY_SUCCESS) && ((LY_ERR)exp != LY_EINCOMPLETE)) {
                    local_c0 = 0;
                    if ((value_len_local != 0) &&
                       ((count == 4 &&
                        (iVar6 = ly_strncmp("[null]",(char *)value_len_local,_r), iVar6 == 0)))) {
                      local_c0 = 0x40;
                    }
                    plVar2 = ext_local;
                    pcVar11 = val[1]._canonical;
                    sVar7 = strlen(val[1]._canonical);
                    plVar3 = val->realtype->exts;
                    sVar10 = strlen((char *)val->realtype->exts);
                    exp._4_4_ = lyd_create_opaq((ly_ctx *)plVar2,pcVar11,sVar7,(char *)0x0,0,
                                                (char *)plVar3,sVar10,(char *)value_len_local,_r,
                                                (ly_bool *)0x0,count,(void *)0x0,local_c0,
                                                &cur_parent);
                    goto joined_r0x00145067;
                  }
                }
                exp._4_4_ = lyd_create_term((lysc_node *)val,(char *)value_len_local,_r,'\0',
                                            path_idx._7_1_,(ly_bool *)0x0,count,(void *)0x0,0x3f3,
                                            (ly_bool *)0x0,&cur_parent);
                goto joined_r0x00145067;
              }
              siblings = lyd_child(cur_parent);
              lyd_find_sibling_schema(siblings,(lysc_node *)val,&cur_parent);
              if (cur_parent == (lyd_node *)0x0) {
                __assert_fail("node",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                              ,0x71d,
                              "LY_ERR lyd_new_path_(struct lyd_node *, const struct ly_ctx *, const struct lysc_ext_instance *, const char *, const void *, size_t, LYD_ANYDATA_VALUETYPE, uint32_t, struct lyd_node **, struct lyd_node **)"
                             );
              }
            }
            if (nnode == (lyd_node *)0x0) {
              nnode = cur_parent;
            }
            node = cur_parent;
            orig_count = orig_count + 1;
          } while( true );
        }
      }
    }
  }
LAB_0014541c:
  exp._4_4_ = LVar5;
  lyxp_expr_free((ly_ctx *)ext_local,(lyxp_expr *)p);
  if (nparent != (lyd_node *)0x0) {
    while( true ) {
      if (nparent == (lyd_node *)0x0) {
        local_1e0 = (void *)0x0;
      }
      else {
        local_1e0 = nparent[-1].priv;
      }
      if (_hints <= local_1e0) break;
      nparent[-1].priv = (void *)((long)nparent[-1].priv + 1);
    }
  }
  ly_path_free((ly_path *)nparent);
  if (exp._4_4_ == LY_SUCCESS) {
    if (new_parent != (lyd_node **)0x0) {
      *new_parent = nnode;
    }
    if (new_node != (lyd_node **)0x0) {
      *new_node = node;
    }
  }
  else {
    lyd_free_tree(nnode);
  }
  return exp._4_4_;
}

Assistant:

static LY_ERR
lyd_new_path_(struct lyd_node *parent, const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, const char *path,
        const void *value, size_t value_len, LYD_ANYDATA_VALUETYPE value_type, uint32_t options,
        struct lyd_node **new_parent, struct lyd_node **new_node)
{
    LY_ERR ret = LY_SUCCESS, r;
    struct lyxp_expr *exp = NULL;
    struct ly_path *p = NULL;
    struct lyd_node *nparent = NULL, *nnode = NULL, *node = NULL, *cur_parent, *iter;
    const struct lysc_node *schema;
    const struct lyd_value *val = NULL;
    ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;
    ly_bool any_use_value = (options & LYD_NEW_ANY_USE_VALUE) ? 1 : 0;
    LY_ARRAY_COUNT_TYPE path_idx = 0, orig_count = 0;
    LY_VALUE_FORMAT format;
    uint32_t hints, count;

    assert(parent || ctx);
    assert(path && ((path[0] == '/') || parent));

    if (!ctx) {
        ctx = LYD_CTX(parent);
    }
    if (value && !value_len) {
        value_len = strlen(value);
    }
    LY_CHECK_GOTO(ret = lyd_new_val_get_format(options, &format), cleanup);

    /* parse path */
    LY_CHECK_GOTO(ret = ly_path_parse(ctx, NULL, path, strlen(path), 0, LY_PATH_BEGIN_EITHER, LY_PATH_PREFIX_FIRST,
            LY_PATH_PRED_SIMPLE, &exp), cleanup);

    /* compile path */
    LY_CHECK_GOTO(ret = ly_path_compile(ctx, NULL, lyd_node_schema(parent), ext, exp, options & LYD_NEW_VAL_OUTPUT ?
            LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT, LY_PATH_TARGET_MANY, 0, LY_VALUE_JSON, NULL, &p), cleanup);

    /* check the compiled path before searching existing nodes, it may be shortened */
    orig_count = LY_ARRAY_COUNT(p);
    LY_CHECK_GOTO(ret = lyd_new_path_check_find_lypath(p, path, value, value_len, format, options), cleanup);

    /* try to find any existing nodes in the path */
    if (parent) {
        r = ly_path_eval_partial(p, parent, NULL, options & LYD_NEW_PATH_WITH_OPAQ, &path_idx, &node);
        if (r == LY_SUCCESS) {
            if (orig_count == LY_ARRAY_COUNT(p)) {
                /* the node exists, are we supposed to update it or is it just a default? */
                if (!(options & LYD_NEW_PATH_UPDATE) && !(node->flags & LYD_DEFAULT)) {
                    LOG_LOCSET(NULL, node);
                    LOGVAL(ctx, LYVE_REFERENCE, "Path \"%s\" already exists.", path);
                    LOG_LOCBACK(0, 1);
                    ret = LY_EEXIST;
                    goto cleanup;
                } else if ((options & LYD_NEW_PATH_UPDATE) && lysc_is_key(node->schema)) {
                    /* fine, the key value must not be changed and has to be in the predicate to be found */
                    goto cleanup;
                }

                /* update the existing node */
                ret = lyd_new_path_update(node, value, value_len, value_type, format, &nparent, &nnode);
                goto cleanup;
            } /* else we were not searching for the whole path */
        } else if (r == LY_EINCOMPLETE) {
            /* some nodes were found, adjust the iterator to the next segment to be created */
            ++path_idx;
        } else if (r == LY_ENOTFOUND) {
            /* we will create the nodes from top-level, default behavior (absolute path), or from the parent (relative path) */
            if (lysc_data_parent(p[0].node)) {
                node = parent;
            }
        } else {
            /* error */
            ret = r;
            goto cleanup;
        }
    }

    /* restore the full path for creating new nodes */
    while (orig_count > LY_ARRAY_COUNT(p)) {
        LY_ARRAY_INCREMENT(p);
    }

    if ((path_idx < LY_ARRAY_COUNT(p)) && lysc_is_dup_inst_list(p[path_idx].node) && p[path_idx].predicates &&
            (p[path_idx].predicates[0].type == LY_PATH_PREDTYPE_POSITION)) {
        /* check the used position of a key-less list or state leaf-list */
        count = 0;
        LYD_LIST_FOR_INST(node ? lyd_child(node) : parent, p[path_idx].node, iter) {
            ++count;
        }

        if (count + 1 < p[path_idx].predicates[0].position) {
            if (count) {
                LOGVAL(ctx, LYVE_REFERENCE,
                        "Cannot create \"%s\" on position %" PRIu64 ", only %" PRIu32 " instance%s exist%s.",
                        p[path_idx].node->name, p[path_idx].predicates[0].position, count, (count > 1) ? "s" : "",
                        (count > 1) ? "" : "s");
            } else {
                LOGVAL(ctx, LYVE_REFERENCE, "Cannot create \"%s\" on position %" PRIu64 ", no instances exist.",
                        p[path_idx].node->name, p[path_idx].predicates[0].position);
            }
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    /* create all the non-existing nodes in a loop */
    for ( ; path_idx < LY_ARRAY_COUNT(p); ++path_idx) {
        cur_parent = node;
        schema = p[path_idx].node;

        switch (schema->nodetype) {
        case LYS_LIST:
            if (lysc_is_dup_inst_list(schema)) {
                /* create key-less list instance */
                LY_CHECK_GOTO(ret = lyd_create_inner(schema, &node), cleanup);
            } else if ((options & LYD_NEW_PATH_OPAQ) && !p[path_idx].predicates) {
                /* creating opaque list without keys */
                LY_CHECK_GOTO(ret = lyd_create_opaq(ctx, schema->name, strlen(schema->name), NULL, 0,
                        schema->module->name, strlen(schema->module->name), NULL, 0, NULL, LY_VALUE_JSON, NULL,
                        LYD_NODEHINT_LIST, &node), cleanup);
            } else {
                /* create standard list instance */
                LY_CHECK_GOTO(ret = lyd_create_list(schema, p[path_idx].predicates, NULL, store_only, &node), cleanup);
            }
            break;
        case LYS_CONTAINER:
        case LYS_NOTIF:
        case LYS_RPC:
        case LYS_ACTION:
            LY_CHECK_GOTO(ret = lyd_create_inner(schema, &node), cleanup);
            break;
        case LYS_LEAFLIST:
            if ((options & LYD_NEW_PATH_OPAQ) &&
                    (!p[path_idx].predicates || (p[path_idx].predicates[0].type != LY_PATH_PREDTYPE_LEAFLIST))) {
                /* we have not checked this only for dup-inst lists, otherwise it must be opaque */
                r = LY_EVALID;
                if (lysc_is_dup_inst_list(schema)) {
                    /* validate value */
                    r = lyd_value_validate(NULL, schema, value ? value : "", value_len, NULL, NULL, NULL);
                }
                if (r && (r != LY_EINCOMPLETE)) {
                    /* creating opaque leaf-list */
                    hints = LYD_NODEHINT_LEAFLIST;
                    if (value && (format == LY_VALUE_JSON) && !ly_strncmp("[null]", value, value_len)) {
                        hints |= LYD_VALHINT_EMPTY;
                    }
                    LY_CHECK_GOTO(ret = lyd_create_opaq(ctx, schema->name, strlen(schema->name), NULL, 0,
                            schema->module->name, strlen(schema->module->name), value, value_len, NULL, format, NULL,
                            hints, &node), cleanup);
                    break;
                }
            }

            /* get value to set */
            if (p[path_idx].predicates && (p[path_idx].predicates[0].type == LY_PATH_PREDTYPE_LEAFLIST)) {
                val = &p[path_idx].predicates[0].value;
            }

            /* create a leaf-list instance */
            if (val) {
                LY_CHECK_GOTO(ret = lyd_create_term2(schema, val, &node), cleanup);
            } else {
                LY_CHECK_GOTO(ret = lyd_create_term(schema, value, value_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &node), cleanup);
            }
            break;
        case LYS_LEAF:
            if (lysc_is_key(schema) && cur_parent->schema) {
                /* it must have been already created or some error will occur later */
                lyd_find_sibling_schema(lyd_child(cur_parent), schema, &node);
                assert(node);
                goto next_iter;
            }

            if (options & LYD_NEW_PATH_OPAQ) {
                if (cur_parent && !cur_parent->schema) {
                    /* always create opaque nodes for opaque parents */
                    r = LY_ENOT;
                } else {
                    /* validate value */
                    r = lyd_value_validate(NULL, schema, value ? value : "", value_len, NULL, NULL, NULL);
                }
                if (r && (r != LY_EINCOMPLETE)) {
                    /* creating opaque leaf */
                    hints = 0;
                    if (value && (format == LY_VALUE_JSON) && !ly_strncmp("[null]", value, value_len)) {
                        hints |= LYD_VALHINT_EMPTY;
                    }
                    LY_CHECK_GOTO(ret = lyd_create_opaq(ctx, schema->name, strlen(schema->name), NULL, 0,
                            schema->module->name, strlen(schema->module->name), value, value_len, NULL, format, NULL, hints, &node),
                            cleanup);
                    break;
                }
            }

            /* create a leaf instance */
            LY_CHECK_GOTO(ret = lyd_create_term(schema, value, value_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &node), cleanup);
            break;
        case LYS_ANYDATA:
        case LYS_ANYXML:
            LY_CHECK_GOTO(ret = lyd_create_any(schema, value, value_type, any_use_value, &node), cleanup);
            break;
        default:
            LOGINT(ctx);
            ret = LY_EINT;
            goto cleanup;
        }

        if (p[path_idx].ext) {
            node->flags |= LYD_EXT;
        }
        if (cur_parent) {
            /* connect to the parent */
            lyd_insert_node(cur_parent, NULL, node, LYD_INSERT_NODE_DEFAULT);
        } else if (parent) {
            /* connect to top-level siblings */
            lyd_insert_node(NULL, &parent, node, LYD_INSERT_NODE_DEFAULT);
        }

next_iter:
        /* update remembered nodes */
        if (!nparent) {
            nparent = node;
        }
        nnode = node;
    }

cleanup:
    lyxp_expr_free(ctx, exp);
    if (p) {
        while (orig_count > LY_ARRAY_COUNT(p)) {
            LY_ARRAY_INCREMENT(p);
        }
    }
    ly_path_free(p);
    if (!ret) {
        /* set out params only on success */
        if (new_parent) {
            *new_parent = nparent;
        }
        if (new_node) {
            *new_node = nnode;
        }
    } else {
        lyd_free_tree(nparent);
    }
    return ret;
}